

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

void __thiscall
DatabaseSnapshot::reindex_dataset
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          string *dataset_name)

{
  bool bVar1;
  runtime_error *this_00;
  reference ppOVar2;
  TaskSpec *done_units;
  Task *in_RSI;
  Indexer *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *taint;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  OnDiskDataset *ds;
  iterator __end1;
  iterator __begin1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  Indexer indexer;
  OnDiskDataset *source;
  DBChange *in_stack_fffffffffffffc78;
  OnDiskDataset *in_stack_fffffffffffffc80;
  Indexer *this_01;
  Indexer *in_stack_fffffffffffffc88;
  Task *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  Task *in_stack_fffffffffffffca8;
  DBChange *in_stack_fffffffffffffcb0;
  OnDiskDataset *__s;
  string *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  DatabaseSnapshot *in_stack_fffffffffffffcc8;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_fffffffffffffcd0;
  DatabaseSnapshot *in_stack_fffffffffffffcd8;
  allocator<char> local_311;
  string local_310 [32];
  string local_2f0 [36];
  undefined4 local_2cc;
  string local_280 [8];
  OnDiskDataset *in_stack_fffffffffffffd88;
  _Self local_208;
  _Self local_200;
  string *local_1f8;
  undefined1 local_1e9 [37];
  undefined4 local_1c4;
  OnDiskDataset *local_178;
  OnDiskDataset **local_170;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_168;
  undefined1 local_160 [24];
  undefined1 *local_148;
  undefined1 *local_140;
  Task **local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [232];
  OnDiskDataset *local_28;
  Task *local_10 [2];
  
  local_10[0] = in_RSI;
  local_28 = find_dataset(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  if (local_28 == (OnDiskDataset *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"source dataset was not found");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Indexer::Indexer(in_RDI,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  Task::spec(local_10[0]);
  OnDiskDataset::get_file_count((OnDiskDataset *)0x189cfd);
  TaskSpec::estimate_work((TaskSpec *)in_stack_fffffffffffffc80,(uint64_t)in_stack_fffffffffffffc78)
  ;
  local_140 = local_110;
  local_138 = local_10;
  this_02 = &local_130;
  __s = local_28;
  std::function<void(std::__cxx11::string_const&)>::
  function<DatabaseSnapshot::reindex_dataset(Task*,std::vector<IndexType,std::allocator<IndexType>>const&,std::__cxx11::string_const&)const::__0,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffc90,(anon_class_16_2_85d9a75d *)in_stack_fffffffffffffc88);
  OnDiskDataset::for_each_filename
            (in_stack_fffffffffffffc80,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffc78);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x189d7d);
  Indexer::finalize(in_stack_fffffffffffffc88);
  local_148 = local_160;
  local_168._M_current =
       (OnDiskDataset **)
       std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                 ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                  in_stack_fffffffffffffc78);
  local_170 = (OnDiskDataset **)
              std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                        ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                         in_stack_fffffffffffffc78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
              ::operator*(&local_168);
    local_178 = *ppOVar2;
    local_1c4 = 1;
    in_stack_fffffffffffffca8 = local_10[0];
    in_stack_fffffffffffffcb0 = (DBChange *)OnDiskDataset::get_name_abi_cxx11_(local_178);
    in_stack_fffffffffffffca0 = (string *)local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)__s,(allocator<char> *)in_stack_fffffffffffffcb0);
    DBChange::DBChange(in_stack_fffffffffffffcb0,(DbChangeType *)in_stack_fffffffffffffca8,
                       in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    Task::change((Task *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    DBChange::~DBChange((DBChange *)in_stack_fffffffffffffc80);
    std::__cxx11::string::~string((string *)(local_1e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1e9);
    in_stack_fffffffffffffc98 = (string *)OnDiskDataset::get_taints_abi_cxx11_(local_28);
    local_1f8 = in_stack_fffffffffffffc98;
    local_200._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc78);
    local_208._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc78);
    while( true ) {
      bVar1 = std::operator!=(&local_200,&local_208);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x189f7e);
      in_stack_fffffffffffffc90 = local_10[0];
      OnDiskDataset::get_id_abi_cxx11_(in_stack_fffffffffffffd88);
      DBChange::DBChange(in_stack_fffffffffffffcb0,(DbChangeType *)in_stack_fffffffffffffca8,
                         in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      Task::change((Task *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      DBChange::~DBChange((DBChange *)in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_280);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffc80);
    }
    __gnu_cxx::
    __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
    ::operator++(&local_168);
  }
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             in_stack_fffffffffffffc90);
  local_2cc = 2;
  OnDiskDataset::get_id_abi_cxx11_(in_stack_fffffffffffffd88);
  this_01 = (Indexer *)&local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)__s,(allocator<char> *)in_stack_fffffffffffffcb0);
  DBChange::DBChange(in_stack_fffffffffffffcb0,(DbChangeType *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Task::change((Task *)this_01,in_stack_fffffffffffffc78);
  DBChange::~DBChange((DBChange *)this_01);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string(local_2f0);
  done_units = Task::spec(local_10[0]);
  TaskSpec::add_progress((TaskSpec *)this_01,(uint64_t)done_units);
  Indexer::~Indexer(this_01);
  return;
}

Assistant:

void DatabaseSnapshot::reindex_dataset(Task *task,
                                       const std::vector<IndexType> &types,
                                       const std::string &dataset_name) const {
    const OnDiskDataset *source = find_dataset(dataset_name);

    if (source == nullptr) {
        throw std::runtime_error("source dataset was not found");
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(source->get_file_count() + 1);

    source->for_each_filename([&indexer, &task](const std::string &target) {
        spdlog::debug("Reindexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    });

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : source->get_taints()) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->change(DBChange(DbChangeType::Drop, source->get_id()));
    task->spec().add_progress(1);
}